

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::text_value_float>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,float>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,float *data)

{
  double dVar1;
  int idx;
  string local_60;
  double value;
  int local_30;
  int n_cols;
  int col;
  int row;
  float *data_local;
  ovf_segment *segment_local;
  ovf_file *f_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  
  n_cols = f->_state->current_line;
  local_30 = f->_state->current_column;
  value._4_4_ = segment->valuedim;
  _col = data;
  data_local = (float *)segment;
  segment_local = (ovf_segment *)f;
  f_local = (ovf_file *)in;
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string(&local_60,in);
  dVar1 = std::__cxx11::stod(&local_60,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  local_30 = local_30 + n_cols * value._4_4_;
  if (local_30 < *(int *)(segment_local->valueunits + 0xb8)) {
    _col[local_30] = (float)dVar1;
    *(int *)(segment_local->valueunits + 0x18) = *(int *)(segment_local->valueunits + 0x18) + 1;
  }
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                int row = f._state->current_line;
                int col = f._state->current_column;

                int n_cols = segment.valuedim;

                double value = std::stod(in.string());

                int idx = col + row*n_cols;

                if( idx < f._state->max_data_index )
                {
                    data[idx] = value;
                    ++f._state->current_column;
                }
            }